

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O0

void do_gain(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  long in_RDI;
  __type_conflict2 _Var2;
  CHAR_DATA *trainer;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA *victim;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  char *in_stack_ffffffffffffedf8;
  
  bVar1 = is_npc(in_stack_ffffffffffffedc8);
  if (!bVar1) {
    for (victim = *(CHAR_DATA **)(*(long *)(in_RDI + 0xa8) + 0x18); victim != (CHAR_DATA *)0x0;
        victim = victim->next_in_room) {
      bVar1 = is_npc(in_stack_ffffffffffffedc8);
      if (bVar1) {
        in_stack_ffffffffffffedd8 = (CHAR_DATA *)victim->act[0];
        _Var2 = std::pow<int,int>(0,0x632903);
        if (((ulong)in_stack_ffffffffffffedd8 & (long)_Var2) != 0) break;
        in_stack_ffffffffffffedd0 = (char *)victim->act[0];
        _Var2 = std::pow<int,int>(0,0x632936);
        if (((ulong)in_stack_ffffffffffffedd0 & (long)_Var2) != 0) break;
      }
    }
    if ((victim == (CHAR_DATA *)0x0) ||
       (bVar1 = can_see((CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                        victim), !bVar1)) {
      send_to_char((char *)victim,in_stack_ffffffffffffedd8);
    }
    else {
      one_argument(in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8);
      if (in_stack_ffffffffffffede8 == '\0') {
        do_say((CHAR_DATA *)arg._312_8_,(char *)arg._304_8_);
        do_say((CHAR_DATA *)arg._312_8_,(char *)arg._304_8_);
      }
      else {
        bVar1 = str_prefix(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
        if (bVar1) {
          bVar1 = str_prefix(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
          if (bVar1) {
            act((char *)victim,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,
                in_stack_ffffffffffffedc8,0);
          }
          else if (*(short *)(in_RDI + 0x1fc) < 1) {
            act((char *)victim,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,
                in_stack_ffffffffffffedc8,0);
          }
          else {
            act((char *)victim,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,
                in_stack_ffffffffffffedc8,0);
            *(short *)(in_RDI + 0x1fa) = *(short *)(in_RDI + 0x1fa) + 10;
            *(short *)(in_RDI + 0x1fc) = *(short *)(in_RDI + 0x1fc) + -1;
          }
        }
        else if (*(short *)(in_RDI + 0x1fa) < 10) {
          act((char *)victim,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,
              in_stack_ffffffffffffedc8,0);
        }
        else {
          act((char *)victim,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,
              in_stack_ffffffffffffedc8,0);
          *(short *)(in_RDI + 0x1fa) = *(short *)(in_RDI + 0x1fa) + -10;
          *(short *)(in_RDI + 0x1fc) = *(short *)(in_RDI + 0x1fc) + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void do_gain(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *trainer;

	if (is_npc(ch))
		return;

	/* find a trainer */
	for (trainer = ch->in_room->people; trainer != nullptr; trainer = trainer->next_in_room)
	{
		if (is_npc(trainer) && (IS_SET(trainer->act, ACT_GAIN) || IS_SET(trainer->act, ACT_TRAIN)))
			break;
	}

	if (trainer == nullptr || !can_see(ch, trainer))
	{
		send_to_char("You can't do that here.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		do_say(trainer, "Use gain convert to convert 10 practices into 1 train.");
		do_say(trainer, "Or use gain revert to revert 1 train into 10 practices.");
		return;
	}

	if (!str_prefix(arg, "convert"))
	{
		if (ch->practice < 10)
		{
			act("$N tells you 'You are not yet ready.'", ch, nullptr, trainer, TO_CHAR);
			return;
		}

		act("$N helps you apply your practice to training", ch, nullptr, trainer, TO_CHAR);
		ch->practice -= 10;
		ch->train += 1;
		return;
	}

	/* 'gain revert' converts one train into 10 pracs */
	if (!str_prefix(arg, "revert"))
	{
		if (ch->train < 1)
		{
			act("$N tells you 'You do not have the training to apply to your skill practices yet.'", ch, nullptr, trainer, TO_CHAR);
			return;
		}

		act("$N helps you apply your training to skills practices.", ch, nullptr, trainer, TO_CHAR);
		ch->practice += 10;
		ch->train -= 1;
		return;
	}

	act("$N tells you 'I do not understand...'", ch, nullptr, trainer, TO_CHAR);
}